

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathValueFlipSign(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr pxVar1;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
    pxVar1 = ctxt->value;
    if (pxVar1 == (xmlXPathObjectPtr)0x0) {
LAB_001d6e58:
      xmlXPathErr(ctxt,0xb);
      return;
    }
    if (pxVar1->type != XPATH_NUMBER) {
      xmlXPathNumberFunction(ctxt,1);
      pxVar1 = ctxt->value;
      if ((pxVar1 == (xmlXPathObjectPtr)0x0) || (pxVar1->type != XPATH_NUMBER)) goto LAB_001d6e58;
    }
    pxVar1->floatval = -pxVar1->floatval;
  }
  return;
}

Assistant:

void
xmlXPathValueFlipSign(xmlXPathParserContextPtr ctxt) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return;
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    ctxt->value->floatval = -ctxt->value->floatval;
}